

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

WhereInfo *
sqlite3WhereBegin(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,
                 ExprList *pResultSet,u16 wctrlFlags,int iAuxArg)

{
  WhereClause *pWC;
  WhereClause *pWC_00;
  SrcList_item *pSVar1;
  u32 *puVar2;
  byte *pbVar3;
  byte bVar4;
  short sVar5;
  Vdbe *p;
  sqlite3 *db;
  ExprList *pEVar6;
  Table *pTVar7;
  SrcList *pSVar8;
  sqlite3 *db_00;
  WhereLoop *pWVar9;
  Schema *pSVar10;
  Index *pIVar11;
  bool bVar12;
  WhereInfo *pWVar13;
  u16 wctrlFlags_00;
  LogEst LVar14;
  int iVar15;
  uint uVar16;
  WhereInfo *pWInfo;
  Expr *pEVar17;
  Expr *pEVar18;
  WhereTerm *pWVar19;
  ExprList_item *pEVar20;
  CollSeq *pCVar21;
  Bitmask BVar22;
  Bitmask BVar23;
  uint uVar24;
  SrcList_item *pSVar25;
  WhereTerm *pWVar26;
  Schema **ppSVar27;
  byte bVar28;
  int iVar29;
  char *pcVar30;
  ulong uVar31;
  WhereLevel *pLevel;
  int op;
  ExprList *pEVar32;
  u8 *puVar33;
  SrcList_item *pSVar34;
  WhereTerm *pWVar35;
  long lVar36;
  VTable *zP4;
  Index *pIVar37;
  WhereLevel *pWVar38;
  ulong uVar39;
  SrcList_item *pSVar40;
  long lVar41;
  SrcList_item *pSVar42;
  u8 uVar43;
  WhereLoopBuilder sWLB;
  uint local_114;
  ulong local_110;
  u16 local_100;
  SrcList_item *local_f8;
  ulong local_d8;
  WhereLoopBuilder local_98;
  Walker local_68;
  
  p = pParse->pVdbe;
  db = pParse->db;
  local_98.pOrSet = (WhereOrSet *)0x0;
  local_98.bldFlags = 0;
  local_98.iPlanLimit = 0;
  local_98.pNew = (WhereLoop *)0x0;
  local_98.pWInfo = (WhereInfo *)0x0;
  local_98.pWC = (WhereClause *)0x0;
  pEVar32 = (ExprList *)0x0;
  if ((pOrderBy != (ExprList *)0x0) && (pOrderBy->nExpr < 0x40)) {
    pEVar32 = pOrderBy;
  }
  uVar24 = wctrlFlags & 0x7eff;
  if ((db->dbOptFlags & 0x10) == 0) {
    uVar24 = (uint)wctrlFlags;
  }
  local_98.pOrderBy = pEVar32;
  if (0x40 < pTabList->nSrc) {
    sqlite3ErrorMsg(pParse,"at most %d tables in a join",0x40);
    return (WhereInfo *)0x0;
  }
  local_114 = 1;
  if ((uVar24 & 0x20) == 0) {
    local_114 = pTabList->nSrc;
  }
  uVar31 = (long)(int)(local_114 * 0x58 + 0x39f) & 0xfffffffffffffff8;
  pWInfo = (WhereInfo *)sqlite3DbMallocRawNN(db,uVar31 + 0x60);
  if (db->mallocFailed != '\0') {
    if (pWInfo != (WhereInfo *)0x0) {
      sqlite3DbFreeNN(db,pWInfo);
    }
    pWInfo = (WhereInfo *)0x0;
    goto LAB_001a32b4;
  }
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->pOrderBy = pEVar32;
  pWInfo->pWhere = pWhere;
  pWInfo->pResultSet = pResultSet;
  pWInfo->aiCurOnePass[0] = -1;
  pWInfo->aiCurOnePass[1] = -1;
  pWInfo->nLevel = (u8)local_114;
  iVar15 = pParse->nLabel + -1;
  pParse->nLabel = iVar15;
  pWInfo->iContinue = iVar15;
  pWInfo->iBreak = iVar15;
  wctrlFlags_00 = (u16)uVar24;
  pWInfo->wctrlFlags = wctrlFlags_00;
  pWInfo->iLimit = (LogEst)iAuxArg;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  pWInfo->nOBSat = '\0';
  pWInfo->sorted = '\0';
  pWInfo->eOnePass = '\0';
  pWInfo->untestedTerms = '\0';
  pWInfo->eDistinct = '\0';
  pWInfo->bOrderedInnerLoop = '\0';
  *(undefined2 *)&pWInfo->field_0x49 = 0;
  *(undefined8 *)&pWInfo->field_0x4b = 0;
  *(undefined8 *)((long)&pWInfo->pLoops + 3) = 0;
  *(undefined8 *)((long)&pWInfo->revMask + 3) = 0;
  *(undefined8 *)&pWInfo->nRowOut = 0;
  pLevel = pWInfo->a;
  memset(pLevel,0,(long)(int)local_114 * 0x58 + 0x60);
  pWC = &pWInfo->sWC;
  local_98.pNew = (WhereLoop *)((long)pWInfo->aiCurOnePass + (uVar31 - 0x2c));
  *(ulong *)((long)pWInfo->aiCurOnePass + uVar31 + 0xc) = (long)pWInfo->aiCurOnePass + uVar31 + 0x1c
  ;
  *(undefined2 *)((long)pWInfo->aiCurOnePass + uVar31) = 0;
  *(undefined2 *)((long)pWInfo->aiCurOnePass + uVar31 + 4) = 3;
  *(undefined4 *)((long)pWInfo->aiCurOnePass + (uVar31 - 4)) = 0;
  (pWInfo->sMaskSet).n = 0;
  (pWInfo->sWC).pWInfo = pWInfo;
  (pWInfo->sWC).hasOr = '\0';
  (pWInfo->sWC).pOuter = (WhereClause *)0x0;
  (pWInfo->sWC).nTerm = 0;
  (pWInfo->sWC).nSlot = 8;
  (pWInfo->sWC).a = (pWInfo->sWC).aStatic;
  local_98.pWInfo = pWInfo;
  local_98.pWC = pWC;
  sqlite3WhereSplit(pWC,pWhere,',');
  if (local_114 == 0) {
    if (pEVar32 != (ExprList *)0x0) {
      pWInfo->nOBSat = (i8)pEVar32->nExpr;
    }
    if ((uVar24 >> 8 & 1) != 0) {
      pWInfo->eDistinct = '\x01';
    }
    sqlite3VdbeExplain(pParse,'\0',"SCAN CONSTANT ROW");
  }
  else {
    local_f8 = pTabList->a;
    lVar41 = 0;
    do {
      iVar15 = pTabList->a[lVar41].iCursor;
      iVar29 = (pWInfo->sMaskSet).n;
      (pWInfo->sMaskSet).n = iVar29 + 1;
      (pWInfo->sMaskSet).ix[iVar29] = iVar15;
      if ((((pTabList->a[lVar41].fg.field_0x1 & 4) != 0) &&
          (pEVar6 = local_f8[lVar41].u1.pFuncArg, pEVar6 != (ExprList *)0x0)) && (0 < pEVar6->nExpr)
         ) {
        pTVar7 = local_f8[lVar41].pTab;
        lVar36 = 0;
        uVar31 = 0;
        do {
          uVar16 = (uint)pTVar7->nCol;
          if ((int)uVar31 < (int)uVar16) {
            uVar31 = (ulong)(int)uVar31;
            bVar12 = true;
            if ((pTVar7->aCol[uVar31].colFlags & 2) == 0) {
              puVar33 = &pTVar7->aCol[uVar31 + 1].colFlags;
              do {
                if ((long)(int)uVar16 - 1U == uVar31) {
                  uVar31 = (ulong)uVar16;
                  goto LAB_001a31a9;
                }
                uVar31 = uVar31 + 1;
                bVar28 = *puVar33;
                puVar33 = puVar33 + 0x20;
              } while ((bVar28 & 2) == 0);
              bVar12 = (long)uVar31 < (long)(int)uVar16;
            }
            if (!bVar12) goto LAB_001a31a9;
            pEVar17 = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
            if (pEVar17 == (Expr *)0x0) {
              bVar12 = false;
            }
            else {
              pEVar17->op = '\0';
              pEVar17->affinity = '\0';
              *(undefined2 *)&pEVar17->field_0x2 = 0;
              pEVar17->flags = 0;
              (pEVar17->u).zToken = (char *)0x0;
              pEVar17->iColumn = 0;
              pEVar17->iAgg = 0;
              pEVar17->iRightJoinTable = 0;
              pEVar17->op2 = '\0';
              pEVar17->field_0x37 = 0;
              pEVar17->pAggInfo = (AggInfo *)0x0;
              (pEVar17->x).pList = (ExprList *)0x0;
              pEVar17->nHeight = 0;
              pEVar17->iTable = 0;
              pEVar17->pLeft = (Expr *)0x0;
              pEVar17->pRight = (Expr *)0x0;
              (pEVar17->y).pTab = (Table *)0x0;
              pEVar17->op = 0xa2;
              pEVar17->iAgg = -1;
              pEVar17->nHeight = 1;
              pEVar17->iTable = local_f8[lVar41].iCursor;
              pEVar17->iColumn = (ynVar)uVar31;
              (pEVar17->y).pTab = pTVar7;
              pEVar18 = pEVar6->a[lVar36].pExpr;
              if (pEVar18 == (Expr *)0x0) {
                pEVar18 = (Expr *)0x0;
              }
              else {
                pEVar18 = exprDup(pParse->db,pEVar18,0,(u8 **)0x0);
              }
              uVar31 = (ulong)((int)uVar31 + 1);
              pEVar18 = sqlite3PExpr(pParse,0xa6,pEVar18,(Expr *)0x0);
              pEVar17 = sqlite3PExpr(pParse,0x35,pEVar17,pEVar18);
              whereClauseInsert(pWC,pEVar17,1);
              bVar12 = true;
            }
          }
          else {
LAB_001a31a9:
            bVar12 = false;
            sqlite3ErrorMsg(pParse,"too many arguments on %s() - max %d",pTVar7->zName);
          }
        } while ((bVar12) && (lVar36 = lVar36 + 1, lVar36 < pEVar6->nExpr));
      }
      lVar41 = lVar41 + 1;
    } while (lVar41 < pTabList->nSrc);
  }
  iVar15 = (pWInfo->sWC).nTerm;
  if (0 < iVar15) {
    iVar15 = iVar15 + 1;
    do {
      exprAnalyze(pTabList,pWC,iVar15 + -2);
      iVar15 = iVar15 + -1;
    } while (1 < iVar15);
  }
  if (db->mallocFailed != '\0') goto LAB_001a32b4;
  if (0 < (local_98.pWC)->nTerm) {
    lVar41 = 0;
    lVar36 = 0;
    do {
      pWVar19 = (local_98.pWC)->a;
      if (((*(byte *)((long)&pWVar19->wtFlags + lVar41) & 2) == 0) &&
         (*(long *)((long)&pWVar19->prereqAll + lVar41) == 0)) {
        if (local_114 != 0) {
          pEVar17 = *(Expr **)((long)&pWVar19->pExpr + lVar41);
          local_68.u.pNC = (NameContext *)0x0;
          local_68.pParse = (Parse *)0x0;
          local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
          local_68.walkerDepth = 0;
          local_68.eCode = '\x01';
          local_68._37_3_ = 0;
          local_68.xExprCallback = exprNodeIsDeterministic;
          local_68.xSelectCallback = sqlite3SelectWalkFail;
          if (pEVar17 != (Expr *)0x0) {
            walkExpr(&local_68,pEVar17);
          }
          if (local_68.eCode == '\0') goto LAB_001a33b4;
        }
        sqlite3ExprIfFalse(pParse,*(Expr **)((long)&pWVar19->pExpr + lVar41),pWInfo->iBreak,0x10);
        pbVar3 = (byte *)((long)&pWVar19->wtFlags + lVar41);
        *pbVar3 = *pbVar3 | 4;
      }
LAB_001a33b4:
      lVar36 = lVar36 + 1;
      lVar41 = lVar41 + 0x40;
    } while (lVar36 < (local_98.pWC)->nTerm);
  }
  if ((uVar24 >> 8 & 1) != 0) {
    if (pTabList->nSrc == 1) {
      iVar15 = pTabList->a[0].iCursor;
      if (0 < (long)pResultSet->nExpr) {
        lVar41 = 0;
        do {
          pEVar17 = pResultSet->a[lVar41].pExpr;
          while ((pEVar17 != (Expr *)0x0 && ((pEVar17->flags & 0x41000) != 0))) {
            if ((pEVar17->flags >> 0x12 & 1) == 0) {
              pEVar20 = (ExprList_item *)&pEVar17->pLeft;
            }
            else {
              pEVar20 = ((pEVar17->x).pList)->a;
            }
            pEVar17 = pEVar20->pExpr;
          }
          if (((pEVar17->op == 0xa2) && (pEVar17->iTable == iVar15)) && (pEVar17->iColumn < 0))
          goto LAB_001a3621;
          lVar41 = lVar41 + 1;
        } while (lVar41 != pResultSet->nExpr);
      }
      for (pIVar37 = (pTabList->a[0].pTab)->pIndex; pIVar37 != (Index *)0x0;
          pIVar37 = pIVar37->pNext) {
        if (pIVar37->onError != '\0') {
          if (pIVar37->nKeyCol == 0) {
            uVar16 = 0;
          }
          else {
            uVar31 = 0;
            do {
              pWVar19 = sqlite3WhereFindTerm(pWC,iVar15,(int)uVar31,0xffffffffffffffff,2,pIVar37);
              if (pWVar19 == (WhereTerm *)0x0) {
                if (pResultSet->nExpr < 1) break;
                pcVar30 = pIVar37->azColl[uVar31];
                uVar39 = 0;
                do {
                  pEVar17 = pResultSet->a[uVar39].pExpr;
                  pEVar18 = pEVar17;
                  while ((pEVar18 != (Expr *)0x0 && ((pEVar18->flags & 0x41000) != 0))) {
                    if ((pEVar18->flags >> 0x12 & 1) == 0) {
                      pEVar20 = (ExprList_item *)&pEVar18->pLeft;
                    }
                    else {
                      pEVar20 = ((pEVar18->x).pList)->a;
                    }
                    pEVar18 = pEVar20->pExpr;
                  }
                  bVar12 = true;
                  if (((pEVar18->op == 0xa2) && (pEVar18->iColumn == pIVar37->aiColumn[uVar31])) &&
                     (pEVar18->iTable == iVar15)) {
                    pCVar21 = sqlite3ExprCollSeq(pParse,pEVar17);
                    if (pCVar21 == (CollSeq *)0x0) {
                      pCVar21 = pParse->db->pDfltColl;
                    }
                    lVar41 = 0;
                    do {
                      bVar28 = pCVar21->zName[lVar41];
                      bVar4 = pcVar30[lVar41];
                      bVar12 = bVar28 != bVar4;
                      if (bVar28 == bVar4) {
                        if ((ulong)bVar28 == 0) {
                          local_f8 = (SrcList_item *)(uVar39 & 0xffffffff);
                          break;
                        }
                      }
                      else if (""[bVar28] != ""[bVar4]) break;
                      lVar41 = lVar41 + 1;
                    } while( true );
                  }
                  if (!bVar12) {
                    iVar29 = (int)local_f8;
                    goto LAB_001a35a6;
                  }
                  uVar39 = uVar39 + 1;
                } while ((long)uVar39 < (long)pResultSet->nExpr);
                iVar29 = -1;
LAB_001a35a6:
                if (iVar29 < 0) break;
                sVar5 = pIVar37->aiColumn[uVar31];
                if ((long)sVar5 < 0) {
                  uVar43 = sVar5 == -1;
                }
                else {
                  uVar43 = pIVar37->pTable->aCol[sVar5].notNull;
                }
                if (uVar43 == '\0') break;
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 < pIVar37->nKeyCol);
            uVar16 = (uint)uVar31;
          }
          if (uVar16 == pIVar37->nKeyCol) goto LAB_001a3621;
        }
      }
    }
    if (pEVar32 == (ExprList *)0x0) {
      *(byte *)&pWInfo->wctrlFlags = (byte)pWInfo->wctrlFlags | 0x80;
      pWInfo->pOrderBy = pResultSet;
    }
  }
LAB_001a3625:
  pWVar9 = local_98.pNew;
  pWVar13 = local_98.pWInfo;
  if ((local_114 == 1) && (((local_98.pWInfo)->wctrlFlags & 0x20) == 0)) {
    pSVar8 = (local_98.pWInfo)->pTabList;
    pTVar7 = pSVar8->a[0].pTab;
    if ((pTVar7->nModuleArg != 0) || ((pSVar8->a[0].fg.field_0x1 & 2) != 0)) goto LAB_001a3725;
    iVar15 = pSVar8->a[0].iCursor;
    pWC_00 = &(local_98.pWInfo)->sWC;
    (local_98.pNew)->wsFlags = 0;
    (local_98.pNew)->nSkip = 0;
    pWVar19 = sqlite3WhereFindTerm(pWC_00,iVar15,-1,0,0x82,(Index *)0x0);
    if (pWVar19 == (WhereTerm *)0x0) {
      for (pIVar37 = pTVar7->pIndex; pIVar37 != (Index *)0x0; pIVar37 = pIVar37->pNext) {
        if (((pIVar37->onError != '\0') && (pIVar37->pPartIdxWhere == (Expr *)0x0)) &&
           (pIVar37->nKeyCol < 4)) {
          if (pIVar37->nKeyCol == 0) {
            uVar16 = 0;
          }
          else {
            bVar28 = pIVar37->field_0x63;
            uVar31 = 0;
            do {
              pWVar19 = sqlite3WhereFindTerm
                                  (pWC_00,iVar15,(int)uVar31,0,(uint)((bVar28 & 8) >> 3) << 7 | 2,
                                   pIVar37);
              if (pWVar19 == (WhereTerm *)0x0) break;
              pWVar9->aLTerm[uVar31] = pWVar19;
              uVar31 = uVar31 + 1;
            } while (uVar31 < pIVar37->nKeyCol);
            uVar16 = (uint)uVar31;
          }
          if (uVar16 == pIVar37->nKeyCol) {
            pWVar9->wsFlags = 0x1201;
            if (((pIVar37->field_0x63 & 0x20) != 0) ||
               ((pSVar8->a[0].colUsed & pIVar37->colNotIdxed) == 0)) {
              pWVar9->wsFlags = 0x1241;
            }
            pWVar9->nLTerm = (u16)uVar16;
            (pWVar9->u).btree.nEq = (u16)uVar16;
            (pWVar9->u).btree.pIndex = pIVar37;
            LVar14 = 0x27;
            goto LAB_001a36c8;
          }
        }
      }
    }
    else {
      pWVar9->wsFlags = 0x1101;
      *pWVar9->aLTerm = pWVar19;
      pWVar9->nLTerm = 1;
      (pWVar9->u).btree.nEq = 1;
      LVar14 = 0x21;
LAB_001a36c8:
      pWVar9->rRun = LVar14;
    }
    if (pWVar9->wsFlags == 0) goto LAB_001a3725;
    pWVar9->nOut = 1;
    pWVar13->a[0].pWLoop = pWVar9;
    pWVar9->maskSelf = 1;
    pWVar13->a[0].iTabCur = iVar15;
    pWVar13->nRowOut = 1;
    if (pWVar13->pOrderBy != (ExprList *)0x0) {
      pWVar13->nOBSat = (i8)pWVar13->pOrderBy->nExpr;
    }
    if ((pWVar13->wctrlFlags & 0x100) != 0) {
      pWVar13->eDistinct = '\x01';
    }
  }
  else {
LAB_001a3725:
    pWVar9 = local_98.pNew;
    pWVar13 = local_98.pWInfo;
    pSVar8 = (local_98.pWInfo)->pTabList;
    bVar28 = (local_98.pWInfo)->nLevel;
    db_00 = (local_98.pWInfo)->pParse->db;
    (local_98.pNew)->aLTerm = (local_98.pNew)->aLTermSpace;
    (local_98.pNew)->nLTerm = 0;
    (local_98.pNew)->nLSlot = 3;
    (local_98.pNew)->wsFlags = 0;
    local_98.iPlanLimit = 20000;
    if ((ulong)bVar28 == 0) {
      whereLoopClear(db_00,local_98.pNew);
    }
    else {
      pSVar40 = pSVar8->a + bVar28;
      pSVar42 = pSVar8->a;
      BVar22 = 0;
      local_110 = 0;
      uVar43 = '\0';
      bVar28 = 0;
      do {
        pWVar9->iTab = uVar43;
        local_98.iPlanLimit = local_98.iPlanLimit + 1000;
        uVar16 = (pWVar13->sMaskSet).n;
        if (0 < (int)uVar16) {
          uVar31 = 0;
          do {
            if ((pWVar13->sMaskSet).ix[uVar31] == pSVar42->iCursor) {
              BVar23 = 1L << ((byte)uVar31 & 0x3f);
              goto LAB_001a37d9;
            }
            uVar31 = uVar31 + 1;
          } while (uVar16 != uVar31);
        }
        BVar23 = 0;
LAB_001a37d9:
        pWVar9->maskSelf = BVar23;
        bVar4 = (pSVar42->fg).jointype;
        if (((bVar28 | bVar4) & 10) != 0) {
          BVar22 = local_110;
        }
        if (pSVar42->pTab->nModuleArg == 0) {
          iVar15 = whereLoopAddBtree(&local_98,BVar22);
          BVar23 = 0;
        }
        else {
          if (pSVar42 + 1 < pSVar40) {
            BVar23 = 0;
            pSVar25 = pSVar42;
            pSVar34 = pSVar42 + 1;
            do {
              if ((BVar23 == 0) && ((*(undefined1 *)((long)(pSVar25 + 1) + 0x3c) & 10) == 0)) {
                BVar23 = 0;
              }
              else {
                if (0 < (int)uVar16) {
                  uVar31 = 0;
                  do {
                    if ((pWVar13->sMaskSet).ix[uVar31] == *(int *)((long)(pSVar25 + 1) + 0x40)) {
                      uVar31 = 1L << ((byte)uVar31 & 0x3f);
                      goto LAB_001a3849;
                    }
                    uVar31 = uVar31 + 1;
                  } while (uVar16 != uVar31);
                }
                uVar31 = 0;
LAB_001a3849:
                BVar23 = uVar31 | BVar23;
              }
              pSVar1 = pSVar34 + 1;
              pSVar25 = pSVar34;
              pSVar34 = pSVar1;
            } while (pSVar1 < pSVar40);
          }
          else {
            BVar23 = 0;
          }
          iVar15 = whereLoopAddVirtual(&local_98,BVar22,BVar23);
        }
        if (iVar15 == 0) {
          if ((local_98.pWC)->hasOr == '\0') {
            iVar15 = 0;
          }
          else {
            iVar15 = whereLoopAddOr(&local_98,BVar22,BVar23);
          }
        }
        local_110 = local_110 | pWVar9->maskSelf;
        bVar12 = false;
        if (iVar15 == 0x65) {
          sqlite3_log(0x1c,"abbreviated query algorithm search");
LAB_001a3913:
          bVar12 = true;
          iVar15 = 0;
        }
        else if (iVar15 == 0) {
          if (db_00->mallocFailed == '\0') goto LAB_001a3913;
          bVar12 = false;
        }
        if (!bVar12) break;
        uVar43 = uVar43 + '\x01';
        pSVar42 = pSVar42 + 1;
        bVar28 = bVar4;
      } while (pSVar42 < pSVar40);
      whereLoopClear(db_00,pWVar9);
      if (iVar15 != 0) goto LAB_001a32b4;
    }
    wherePathSolver(pWInfo,0);
    if ((db->mallocFailed != '\0') ||
       ((pWInfo->pOrderBy != (ExprList *)0x0 &&
        (wherePathSolver(pWInfo,(short)*(undefined4 *)&pWInfo->nRowOut + 1),
        db->mallocFailed != '\0')))) goto LAB_001a32b4;
  }
  if ((pWInfo->pOrderBy == (ExprList *)0x0) && ((db->flags & 0x1000) != 0)) {
    pWInfo->revMask = 0xffffffffffffffff;
  }
  if ((pParse->nErr != 0) || (db->mallocFailed != '\0')) goto LAB_001a32b4;
  local_d8 = 0xffffffffffffffff;
  if ((pResultSet != (ExprList *)0x0) && ((1 < pWInfo->nLevel && ((db->dbOptFlags & 0x100) == 0))))
  {
    BVar22 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,pResultSet);
    if (local_98.pOrderBy != (ExprList *)0x0) {
      BVar23 = sqlite3WhereExprListUsage(&pWInfo->sMaskSet,local_98.pOrderBy);
      BVar22 = BVar22 | BVar23;
    }
    if (1 < (ulong)pWInfo->nLevel) {
      local_d8 = 0xffffffffffffffff;
      uVar31 = (ulong)pWInfo->nLevel;
      do {
        pWVar9 = pWInfo->a[uVar31 - 1].pWLoop;
        if (((pWInfo->pTabList->a[pWVar9->iTab].fg.jointype & 8) != 0) &&
           ((((uVar24 >> 8 & 1) != 0 || ((pWVar9->wsFlags & 0x1000) != 0)) &&
            (uVar39 = pWVar9->maskSelf, (uVar39 & BVar22) == 0)))) {
          pWVar19 = (local_98.pWC)->a;
          iVar15 = (local_98.pWC)->nTerm;
          pWVar26 = pWVar19 + iVar15;
          pWVar35 = pWVar19;
          if (0 < (long)iVar15) {
            do {
              if (((pWVar35->prereqAll & uVar39) != 0) &&
                 (((pWVar35->pExpr->flags & 1) == 0 ||
                  (pWInfo->pTabList->a[pWVar9->iTab].iCursor != (int)pWVar35->pExpr->iRightJoinTable
                  )))) goto LAB_001a3b33;
              pWVar35 = pWVar35 + 1;
            } while (pWVar35 < pWVar26);
          }
          if (0 < iVar15) {
            do {
              if ((pWVar19->prereqAll & uVar39) != 0) {
                *(byte *)&pWVar19->wtFlags = (byte)pWVar19->wtFlags | 4;
              }
              pWVar19 = pWVar19 + 1;
            } while (pWVar19 < pWVar26);
          }
          if (uVar31 != pWInfo->nLevel) {
            memmove(pLevel + (uVar31 - 1),pLevel + uVar31,
                    (long)((ulong)((uint)pWInfo->nLevel - (int)uVar31) * 0x5800000000) >> 0x20);
          }
          local_d8 = local_d8 & ~uVar39;
          pWInfo->nLevel = pWInfo->nLevel + 0xff;
          local_114 = local_114 - 1;
        }
LAB_001a3b33:
        bVar12 = 2 < (long)uVar31;
        uVar31 = uVar31 - 1;
      } while (bVar12);
    }
  }
  puVar2 = &pWInfo->pParse->nQueryLoop;
  *puVar2 = *puVar2 + (int)pWInfo->nRowOut;
  if ((uVar24 & 4) == 0) {
LAB_001a3cc8:
    local_100 = 0;
  }
  else {
    pWVar9 = pWInfo->a[0].pWLoop;
    uVar16 = pWVar9->wsFlags;
    uVar43 = '\x01';
    if (((uVar16 >> 0xc & 1) == 0) &&
       ((((uVar24 & 8) == 0 || ((pTabList->a[0].pTab)->nModuleArg != 0)) ||
        ((uVar43 = '\x02', (uVar24 & 0x10) == 0 && ((uVar16 & 0x2000) != 0)))))) goto LAB_001a3cc8;
    pWInfo->eOnePass = uVar43;
    local_100 = 0;
    if ((uVar16 & 0x40) == 0) goto LAB_001a3cc8;
    if (((pTabList->a[0].pTab)->tabFlags & 0x20) == 0) {
      pWVar9->wsFlags = uVar16 & 0xffffffbf;
      local_100 = wctrlFlags_00 & 8;
    }
  }
  if (0 < (int)local_114) {
    uVar16 = 0;
    pWVar38 = pLevel;
    do {
      bVar28 = pWVar38->iFrom;
      pTVar7 = pTabList->a[bVar28].pTab;
      if (pTVar7->pSchema == (Schema *)0x0) {
        iVar15 = -1000000;
      }
      else {
        iVar15 = -1;
        ppSVar27 = &db->aDb->pSchema;
        do {
          iVar15 = iVar15 + 1;
          pSVar10 = *ppSVar27;
          ppSVar27 = ppSVar27 + 4;
        } while (pSVar10 != pTVar7->pSchema);
      }
      pWVar9 = pWVar38->pWLoop;
      if (((pTVar7->tabFlags & 2) == 0) && (pTVar7->pSelect == (Select *)0x0)) {
        if ((pWVar9->wsFlags >> 10 & 1) == 0) {
          if (pTVar7->nModuleArg == 0) {
            if ((pWVar9->wsFlags & 0x40) == 0 && (uVar24 & 0x20) == 0) {
              if (pWInfo->eOnePass == '\0') {
                iVar29 = 0x6c;
              }
              else {
                pWInfo->aiCurOnePass[0] = pTabList->a[bVar28].iCursor;
                iVar29 = 0x6d;
              }
              sqlite3OpenTable(pParse,pTabList->a[bVar28].iCursor,iVar15,pTVar7,iVar29);
              if (((pWInfo->eOnePass == '\0') && (pTVar7->nCol < 0x40)) &&
                 ((pTVar7->tabFlags & 0x20) == 0)) {
                uVar31 = pTabList->a[bVar28].colUsed;
                uVar39 = 0x3f;
                if (uVar31 != 0) {
                  for (; uVar31 >> uVar39 == 0; uVar39 = uVar39 - 1) {
                  }
                }
                pcVar30 = (char *)((uVar39 ^ 0xffffffffffffffc0) + 0x41);
                if (uVar31 == 0) {
                  pcVar30 = (char *)0x0;
                }
                sqlite3VdbeChangeP4(p,-1,pcVar30,-3);
              }
              if (0 < (long)p->nOp) {
                p->aOp[(long)p->nOp + -1].p5 = local_100;
              }
            }
            else {
              sqlite3TableLock(pParse,iVar15,pTVar7->tnum,'\0',pTVar7->zName);
            }
          }
        }
        else {
          for (zP4 = pTVar7->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db)); zP4 = zP4->pNext) {
          }
          iVar29 = sqlite3VdbeAddOp3(p,0xa3,pTabList->a[bVar28].iCursor,0,0);
          sqlite3VdbeChangeP4(p,iVar29,(char *)zP4,-0xc);
        }
      }
      if ((pWVar9->wsFlags & 0x200) != 0) {
        pIVar37 = (pWVar9->u).btree.pIndex;
        if ((((pTVar7->tabFlags & 0x20) == 0) || ((uVar24 & 0x20) == 0)) ||
           ((*(ushort *)&pIVar37->field_0x63 & 3) != 2)) {
          iVar29 = iAuxArg;
          if (pWInfo->eOnePass == '\0') {
            if (iAuxArg != 0 && (uVar24 & 0x20) != 0) {
              op = 0x6a;
              bVar12 = false;
              goto LAB_001a3e74;
            }
            iVar29 = pParse->nTab;
            pParse->nTab = iVar29 + 1;
            op = 0x6c;
          }
          else {
            for (pIVar11 = (pTabList->a[bVar28].pTab)->pIndex;
                (pIVar11 != (Index *)0x0 && (pIVar11 != pIVar37)); pIVar11 = pIVar11->pNext) {
              iVar29 = iVar29 + 1;
            }
            pWInfo->aiCurOnePass[1] = iVar29;
            op = 0x6d;
          }
          bVar12 = false;
        }
        else {
          iVar29 = pWVar38->iTabCur;
          op = 0;
          bVar12 = true;
        }
LAB_001a3e74:
        pWVar38->iIdxCur = iVar29;
        if (!bVar12) {
          sqlite3VdbeAddOp3(p,op,iVar29,pIVar37->tnum,iVar15);
          sqlite3VdbeSetP4KeyInfo(pParse,pIVar37);
          if (((((pWVar9->wsFlags & 0x8002) == 0 && (pWVar9->wsFlags & 0xf) != 0) &&
               ((pWInfo->wctrlFlags & 1) == 0)) && (pWInfo->eDistinct != '\x02')) &&
             (0 < (long)p->nOp)) {
            p->aOp[(long)p->nOp + -1].p5 = 2;
          }
        }
      }
      if (-1 < iVar15) {
        sqlite3CodeVerifySchema(pParse,iVar15);
      }
      uVar16 = uVar16 + 1;
      pWVar38 = pWVar38 + 1;
    } while (uVar16 != local_114);
  }
  pWInfo->iTop = p->nOp;
  if (db->mallocFailed == '\0') {
    if ((int)local_114 < 1) {
      return pWInfo;
    }
    uVar31 = 0;
    while( true ) {
      if (((pLevel->pWLoop->wsFlags & 0x4000) == 0) ||
         (constructAutomaticIndex(pParse,pWC,pTabList->a + pLevel->iFrom,local_d8,pLevel),
         db->mallocFailed == '\0')) {
        sqlite3WhereExplainOneScan(pParse,pTabList,pLevel,wctrlFlags_00);
        pLevel->addrBody = p->nOp;
        local_d8 = sqlite3WhereCodeOneLoopStart(pParse,p,pWInfo,(int)uVar31,pLevel,local_d8);
        pWInfo->iContinue = pLevel->addrCont;
        bVar12 = true;
      }
      else {
        bVar12 = false;
      }
      if (!bVar12) break;
      uVar31 = uVar31 + 1;
      pLevel = pLevel + 1;
      if (local_114 == uVar31) {
        return pWInfo;
      }
    }
  }
LAB_001a32b4:
  if (pWInfo != (WhereInfo *)0x0) {
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db,pWInfo);
  }
  return (WhereInfo *)0x0;
LAB_001a3621:
  pWInfo->eDistinct = '\x01';
  goto LAB_001a3625;
}

Assistant:

SQLITE_PRIVATE WhereInfo *sqlite3WhereBegin(
  Parse *pParse,          /* The parser context */
  SrcList *pTabList,      /* FROM clause: A list of all tables to be scanned */
  Expr *pWhere,           /* The WHERE clause */
  ExprList *pOrderBy,     /* An ORDER BY (or GROUP BY) clause, or NULL */
  ExprList *pResultSet,   /* Query result set.  Req'd for DISTINCT */
  u16 wctrlFlags,         /* The WHERE_* flags defined in sqliteInt.h */
  int iAuxArg             /* If WHERE_OR_SUBCLAUSE is set, index cursor number
                          ** If WHERE_USE_LIMIT, then the limit amount */
){
  int nByteWInfo;            /* Num. bytes allocated for WhereInfo struct */
  int nTabList;              /* Number of elements in pTabList */
  WhereInfo *pWInfo;         /* Will become the return value of this function */
  Vdbe *v = pParse->pVdbe;   /* The virtual database engine */
  Bitmask notReady;          /* Cursors that are not yet positioned */
  WhereLoopBuilder sWLB;     /* The WhereLoop builder */
  WhereMaskSet *pMaskSet;    /* The expression mask set */
  WhereLevel *pLevel;        /* A single level in pWInfo->a[] */
  WhereLoop *pLoop;          /* Pointer to a single WhereLoop object */
  int ii;                    /* Loop counter */
  sqlite3 *db;               /* Database connection */
  int rc;                    /* Return code */
  u8 bFordelete = 0;         /* OPFLAG_FORDELETE or zero, as appropriate */

  assert( (wctrlFlags & WHERE_ONEPASS_MULTIROW)==0 || (
        (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 
     && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 
  ));

  /* Only one of WHERE_OR_SUBCLAUSE or WHERE_USE_LIMIT */
  assert( (wctrlFlags & WHERE_OR_SUBCLAUSE)==0
            || (wctrlFlags & WHERE_USE_LIMIT)==0 );

  /* Variable initialization */
  db = pParse->db;
  memset(&sWLB, 0, sizeof(sWLB));

  /* An ORDER/GROUP BY clause of more than 63 terms cannot be optimized */
  testcase( pOrderBy && pOrderBy->nExpr==BMS-1 );
  if( pOrderBy && pOrderBy->nExpr>=BMS ) pOrderBy = 0;
  sWLB.pOrderBy = pOrderBy;

  /* Disable the DISTINCT optimization if SQLITE_DistinctOpt is set via
  ** sqlite3_test_ctrl(SQLITE_TESTCTRL_OPTIMIZATIONS,...) */
  if( OptimizationDisabled(db, SQLITE_DistinctOpt) ){
    wctrlFlags &= ~WHERE_WANT_DISTINCT;
  }

  /* The number of tables in the FROM clause is limited by the number of
  ** bits in a Bitmask 
  */
  testcase( pTabList->nSrc==BMS );
  if( pTabList->nSrc>BMS ){
    sqlite3ErrorMsg(pParse, "at most %d tables in a join", BMS);
    return 0;
  }

  /* This function normally generates a nested loop for all tables in 
  ** pTabList.  But if the WHERE_OR_SUBCLAUSE flag is set, then we should
  ** only generate code for the first table in pTabList and assume that
  ** any cursors associated with subsequent tables are uninitialized.
  */
  nTabList = (wctrlFlags & WHERE_OR_SUBCLAUSE) ? 1 : pTabList->nSrc;

  /* Allocate and initialize the WhereInfo structure that will become the
  ** return value. A single allocation is used to store the WhereInfo
  ** struct, the contents of WhereInfo.a[], the WhereClause structure
  ** and the WhereMaskSet structure. Since WhereClause contains an 8-byte
  ** field (type Bitmask) it must be aligned on an 8-byte boundary on
  ** some architectures. Hence the ROUND8() below.
  */
  nByteWInfo = ROUND8(sizeof(WhereInfo)+(nTabList-1)*sizeof(WhereLevel));
  pWInfo = sqlite3DbMallocRawNN(db, nByteWInfo + sizeof(WhereLoop));
  if( db->mallocFailed ){
    sqlite3DbFree(db, pWInfo);
    pWInfo = 0;
    goto whereBeginError;
  }
  pWInfo->pParse = pParse;
  pWInfo->pTabList = pTabList;
  pWInfo->pOrderBy = pOrderBy;
  pWInfo->pWhere = pWhere;
  pWInfo->pResultSet = pResultSet;
  pWInfo->aiCurOnePass[0] = pWInfo->aiCurOnePass[1] = -1;
  pWInfo->nLevel = nTabList;
  pWInfo->iBreak = pWInfo->iContinue = sqlite3VdbeMakeLabel(pParse);
  pWInfo->wctrlFlags = wctrlFlags;
  pWInfo->iLimit = iAuxArg;
  pWInfo->savedNQueryLoop = pParse->nQueryLoop;
  memset(&pWInfo->nOBSat, 0, 
         offsetof(WhereInfo,sWC) - offsetof(WhereInfo,nOBSat));
  memset(&pWInfo->a[0], 0, sizeof(WhereLoop)+nTabList*sizeof(WhereLevel));
  assert( pWInfo->eOnePass==ONEPASS_OFF );  /* ONEPASS defaults to OFF */
  pMaskSet = &pWInfo->sMaskSet;
  sWLB.pWInfo = pWInfo;
  sWLB.pWC = &pWInfo->sWC;
  sWLB.pNew = (WhereLoop*)(((char*)pWInfo)+nByteWInfo);
  assert( EIGHT_BYTE_ALIGNMENT(sWLB.pNew) );
  whereLoopInit(sWLB.pNew);
#ifdef SQLITE_DEBUG
  sWLB.pNew->cId = '*';
#endif

  /* Split the WHERE clause into separate subexpressions where each
  ** subexpression is separated by an AND operator.
  */
  initMaskSet(pMaskSet);
  sqlite3WhereClauseInit(&pWInfo->sWC, pWInfo);
  sqlite3WhereSplit(&pWInfo->sWC, pWhere, TK_AND);
    
  /* Special case: No FROM clause
  */
  if( nTabList==0 ){
    if( pOrderBy ) pWInfo->nOBSat = pOrderBy->nExpr;
    if( wctrlFlags & WHERE_WANT_DISTINCT ){
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }
    ExplainQueryPlan((pParse, 0, "SCAN CONSTANT ROW"));
  }else{
    /* Assign a bit from the bitmask to every term in the FROM clause.
    **
    ** The N-th term of the FROM clause is assigned a bitmask of 1<<N.
    **
    ** The rule of the previous sentence ensures thta if X is the bitmask for
    ** a table T, then X-1 is the bitmask for all other tables to the left of T.
    ** Knowing the bitmask for all tables to the left of a left join is
    ** important.  Ticket #3015.
    **
    ** Note that bitmasks are created for all pTabList->nSrc tables in
    ** pTabList, not just the first nTabList tables.  nTabList is normally
    ** equal to pTabList->nSrc but might be shortened to 1 if the
    ** WHERE_OR_SUBCLAUSE flag is set.
    */
    ii = 0;
    do{
      createMask(pMaskSet, pTabList->a[ii].iCursor);
      sqlite3WhereTabFuncArgs(pParse, &pTabList->a[ii], &pWInfo->sWC);
    }while( (++ii)<pTabList->nSrc );
  #ifdef SQLITE_DEBUG
    {
      Bitmask mx = 0;
      for(ii=0; ii<pTabList->nSrc; ii++){
        Bitmask m = sqlite3WhereGetMask(pMaskSet, pTabList->a[ii].iCursor);
        assert( m>=mx );
        mx = m;
      }
    }
  #endif
  }
  
  /* Analyze all of the subexpressions. */
  sqlite3WhereExprAnalyze(pTabList, &pWInfo->sWC);
  if( db->mallocFailed ) goto whereBeginError;

  /* Special case: WHERE terms that do not refer to any tables in the join
  ** (constant expressions). Evaluate each such term, and jump over all the
  ** generated code if the result is not true.  
  **
  ** Do not do this if the expression contains non-deterministic functions
  ** that are not within a sub-select. This is not strictly required, but
  ** preserves SQLite's legacy behaviour in the following two cases:
  **
  **   FROM ... WHERE random()>0;           -- eval random() once per row
  **   FROM ... WHERE (SELECT random())>0;  -- eval random() once overall
  */
  for(ii=0; ii<sWLB.pWC->nTerm; ii++){
    WhereTerm *pT = &sWLB.pWC->a[ii];
    if( pT->wtFlags & TERM_VIRTUAL ) continue;
    if( pT->prereqAll==0 && (nTabList==0 || exprIsDeterministic(pT->pExpr)) ){
      sqlite3ExprIfFalse(pParse, pT->pExpr, pWInfo->iBreak, SQLITE_JUMPIFNULL);
      pT->wtFlags |= TERM_CODED;
    }
  }

  if( wctrlFlags & WHERE_WANT_DISTINCT ){
    if( isDistinctRedundant(pParse, pTabList, &pWInfo->sWC, pResultSet) ){
      /* The DISTINCT marking is pointless.  Ignore it. */
      pWInfo->eDistinct = WHERE_DISTINCT_UNIQUE;
    }else if( pOrderBy==0 ){
      /* Try to ORDER BY the result set to make distinct processing easier */
      pWInfo->wctrlFlags |= WHERE_DISTINCTBY;
      pWInfo->pOrderBy = pResultSet;
    }
  }

  /* Construct the WhereLoop objects */
#if defined(WHERETRACE_ENABLED)
  if( sqlite3WhereTrace & 0xffff ){
    sqlite3DebugPrintf("*** Optimizer Start *** (wctrlFlags: 0x%x",wctrlFlags);
    if( wctrlFlags & WHERE_USE_LIMIT ){
      sqlite3DebugPrintf(", limit: %d", iAuxArg);
    }
    sqlite3DebugPrintf(")\n");
  }
  if( sqlite3WhereTrace & 0x100 ){ /* Display all terms of the WHERE clause */
    sqlite3WhereClausePrint(sWLB.pWC);
  }
#endif

  if( nTabList!=1 || whereShortCut(&sWLB)==0 ){
    rc = whereLoopAddAll(&sWLB);
    if( rc ) goto whereBeginError;
  
#ifdef WHERETRACE_ENABLED
    if( sqlite3WhereTrace ){    /* Display all of the WhereLoop objects */
      WhereLoop *p;
      int i;
      static const char zLabel[] = "0123456789abcdefghijklmnopqrstuvwyxz"
                                             "ABCDEFGHIJKLMNOPQRSTUVWYXZ";
      for(p=pWInfo->pLoops, i=0; p; p=p->pNextLoop, i++){
        p->cId = zLabel[i%(sizeof(zLabel)-1)];
        whereLoopPrint(p, sWLB.pWC);
      }
    }
#endif
  
    wherePathSolver(pWInfo, 0);
    if( db->mallocFailed ) goto whereBeginError;
    if( pWInfo->pOrderBy ){
       wherePathSolver(pWInfo, pWInfo->nRowOut+1);
       if( db->mallocFailed ) goto whereBeginError;
    }
  }
  if( pWInfo->pOrderBy==0 && (db->flags & SQLITE_ReverseOrder)!=0 ){
     pWInfo->revMask = ALLBITS;
  }
  if( pParse->nErr || NEVER(db->mallocFailed) ){
    goto whereBeginError;
  }
#ifdef WHERETRACE_ENABLED
  if( sqlite3WhereTrace ){
    sqlite3DebugPrintf("---- Solution nRow=%d", pWInfo->nRowOut);
    if( pWInfo->nOBSat>0 ){
      sqlite3DebugPrintf(" ORDERBY=%d,0x%llx", pWInfo->nOBSat, pWInfo->revMask);
    }
    switch( pWInfo->eDistinct ){
      case WHERE_DISTINCT_UNIQUE: {
        sqlite3DebugPrintf("  DISTINCT=unique");
        break;
      }
      case WHERE_DISTINCT_ORDERED: {
        sqlite3DebugPrintf("  DISTINCT=ordered");
        break;
      }
      case WHERE_DISTINCT_UNORDERED: {
        sqlite3DebugPrintf("  DISTINCT=unordered");
        break;
      }
    }
    sqlite3DebugPrintf("\n");
    for(ii=0; ii<pWInfo->nLevel; ii++){
      whereLoopPrint(pWInfo->a[ii].pWLoop, sWLB.pWC);
    }
  }
#endif

  /* Attempt to omit tables from the join that do not affect the result.
  ** For a table to not affect the result, the following must be true:
  **
  **   1) The query must not be an aggregate.
  **   2) The table must be the RHS of a LEFT JOIN.
  **   3) Either the query must be DISTINCT, or else the ON or USING clause
  **      must contain a constraint that limits the scan of the table to 
  **      at most a single row.
  **   4) The table must not be referenced by any part of the query apart
  **      from its own USING or ON clause.
  **
  ** For example, given:
  **
  **     CREATE TABLE t1(ipk INTEGER PRIMARY KEY, v1);
  **     CREATE TABLE t2(ipk INTEGER PRIMARY KEY, v2);
  **     CREATE TABLE t3(ipk INTEGER PRIMARY KEY, v3);
  **
  ** then table t2 can be omitted from the following:
  **
  **     SELECT v1, v3 FROM t1 
  **       LEFT JOIN t2 USING (t1.ipk=t2.ipk)
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  **
  ** or from:
  **
  **     SELECT DISTINCT v1, v3 FROM t1 
  **       LEFT JOIN t2
  **       LEFT JOIN t3 USING (t1.ipk=t3.ipk)
  */
  notReady = ~(Bitmask)0;
  if( pWInfo->nLevel>=2
   && pResultSet!=0               /* guarantees condition (1) above */
   && OptimizationEnabled(db, SQLITE_OmitNoopJoin)
  ){
    int i;
    Bitmask tabUsed = sqlite3WhereExprListUsage(pMaskSet, pResultSet);
    if( sWLB.pOrderBy ){
      tabUsed |= sqlite3WhereExprListUsage(pMaskSet, sWLB.pOrderBy);
    }
    for(i=pWInfo->nLevel-1; i>=1; i--){
      WhereTerm *pTerm, *pEnd;
      struct SrcList_item *pItem;
      pLoop = pWInfo->a[i].pWLoop;
      pItem = &pWInfo->pTabList->a[pLoop->iTab];
      if( (pItem->fg.jointype & JT_LEFT)==0 ) continue;
      if( (wctrlFlags & WHERE_WANT_DISTINCT)==0
       && (pLoop->wsFlags & WHERE_ONEROW)==0
      ){
        continue;
      }
      if( (tabUsed & pLoop->maskSelf)!=0 ) continue;
      pEnd = sWLB.pWC->a + sWLB.pWC->nTerm;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          if( !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
           || pTerm->pExpr->iRightJoinTable!=pItem->iCursor
          ){
            break;
          }
        }
      }
      if( pTerm<pEnd ) continue;
      WHERETRACE(0xffff, ("-> drop loop %c not used\n", pLoop->cId));
      notReady &= ~pLoop->maskSelf;
      for(pTerm=sWLB.pWC->a; pTerm<pEnd; pTerm++){
        if( (pTerm->prereqAll & pLoop->maskSelf)!=0 ){
          pTerm->wtFlags |= TERM_CODED;
        }
      }
      if( i!=pWInfo->nLevel-1 ){
        int nByte = (pWInfo->nLevel-1-i) * sizeof(WhereLevel);
        memmove(&pWInfo->a[i], &pWInfo->a[i+1], nByte);
      }
      pWInfo->nLevel--;
      nTabList--;
    }
  }
  WHERETRACE(0xffff,("*** Optimizer Finished ***\n"));
  pWInfo->pParse->nQueryLoop += pWInfo->nRowOut;

  /* If the caller is an UPDATE or DELETE statement that is requesting
  ** to use a one-pass algorithm, determine if this is appropriate.
  **
  ** A one-pass approach can be used if the caller has requested one
  ** and either (a) the scan visits at most one row or (b) each
  ** of the following are true:
  **
  **   * the caller has indicated that a one-pass approach can be used
  **     with multiple rows (by setting WHERE_ONEPASS_MULTIROW), and
  **   * the table is not a virtual table, and
  **   * either the scan does not use the OR optimization or the caller
  **     is a DELETE operation (WHERE_DUPLICATES_OK is only specified
  **     for DELETE).
  **
  ** The last qualification is because an UPDATE statement uses
  ** WhereInfo.aiCurOnePass[1] to determine whether or not it really can
  ** use a one-pass approach, and this is not set accurately for scans
  ** that use the OR optimization.
  */
  assert( (wctrlFlags & WHERE_ONEPASS_DESIRED)==0 || pWInfo->nLevel==1 );
  if( (wctrlFlags & WHERE_ONEPASS_DESIRED)!=0 ){
    int wsFlags = pWInfo->a[0].pWLoop->wsFlags;
    int bOnerow = (wsFlags & WHERE_ONEROW)!=0;
    assert( !(wsFlags & WHERE_VIRTUALTABLE) || IsVirtual(pTabList->a[0].pTab) );
    if( bOnerow || (
        0!=(wctrlFlags & WHERE_ONEPASS_MULTIROW)
     && !IsVirtual(pTabList->a[0].pTab)
     && (0==(wsFlags & WHERE_MULTI_OR) || (wctrlFlags & WHERE_DUPLICATES_OK))
    )){
      pWInfo->eOnePass = bOnerow ? ONEPASS_SINGLE : ONEPASS_MULTI;
      if( HasRowid(pTabList->a[0].pTab) && (wsFlags & WHERE_IDX_ONLY) ){
        if( wctrlFlags & WHERE_ONEPASS_MULTIROW ){
          bFordelete = OPFLAG_FORDELETE;
        }
        pWInfo->a[0].pWLoop->wsFlags = (wsFlags & ~WHERE_IDX_ONLY);
      }
    }
  }

  /* Open all tables in the pTabList and any indices selected for
  ** searching those tables.
  */
  for(ii=0, pLevel=pWInfo->a; ii<nTabList; ii++, pLevel++){
    Table *pTab;     /* Table to open */
    int iDb;         /* Index of database containing table/index */
    struct SrcList_item *pTabItem;

    pTabItem = &pTabList->a[pLevel->iFrom];
    pTab = pTabItem->pTab;
    iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    pLoop = pLevel->pWLoop;
    if( (pTab->tabFlags & TF_Ephemeral)!=0 || pTab->pSelect ){
      /* Do nothing */
    }else
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( (pLoop->wsFlags & WHERE_VIRTUALTABLE)!=0 ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      int iCur = pTabItem->iCursor;
      sqlite3VdbeAddOp4(v, OP_VOpen, iCur, 0, 0, pVTab, P4_VTAB);
    }else if( IsVirtual(pTab) ){
      /* noop */
    }else
#endif
    if( (pLoop->wsFlags & WHERE_IDX_ONLY)==0
         && (wctrlFlags & WHERE_OR_SUBCLAUSE)==0 ){
      int op = OP_OpenRead;
      if( pWInfo->eOnePass!=ONEPASS_OFF ){
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[0] = pTabItem->iCursor;
      };
      sqlite3OpenTable(pParse, pTabItem->iCursor, iDb, pTab, op);
      assert( pTabItem->iCursor==pLevel->iTabCur );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS-1 );
      testcase( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol==BMS );
      if( pWInfo->eOnePass==ONEPASS_OFF && pTab->nCol<BMS && HasRowid(pTab) ){
        Bitmask b = pTabItem->colUsed;
        int n = 0;
        for(; b; b=b>>1, n++){}
        sqlite3VdbeChangeP4(v, -1, SQLITE_INT_TO_PTR(n), P4_INT32);
        assert( n<=pTab->nCol );
      }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
      if( pLoop->u.btree.pIndex!=0 ){
        sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ|bFordelete);
      }else
#endif
      {
        sqlite3VdbeChangeP5(v, bFordelete);
      }
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
      sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, pTabItem->iCursor, 0, 0,
                            (const u8*)&pTabItem->colUsed, P4_INT64);
#endif
    }else{
      sqlite3TableLock(pParse, iDb, pTab->tnum, 0, pTab->zName);
    }
    if( pLoop->wsFlags & WHERE_INDEXED ){
      Index *pIx = pLoop->u.btree.pIndex;
      int iIndexCur;
      int op = OP_OpenRead;
      /* iAuxArg is always set to a positive value if ONEPASS is possible */
      assert( iAuxArg!=0 || (pWInfo->wctrlFlags & WHERE_ONEPASS_DESIRED)==0 );
      if( !HasRowid(pTab) && IsPrimaryKeyIndex(pIx)
       && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0
      ){
        /* This is one term of an OR-optimization using the PRIMARY KEY of a
        ** WITHOUT ROWID table.  No need for a separate index */
        iIndexCur = pLevel->iTabCur;
        op = 0;
      }else if( pWInfo->eOnePass!=ONEPASS_OFF ){
        Index *pJ = pTabItem->pTab->pIndex;
        iIndexCur = iAuxArg;
        assert( wctrlFlags & WHERE_ONEPASS_DESIRED );
        while( ALWAYS(pJ) && pJ!=pIx ){
          iIndexCur++;
          pJ = pJ->pNext;
        }
        op = OP_OpenWrite;
        pWInfo->aiCurOnePass[1] = iIndexCur;
      }else if( iAuxArg && (wctrlFlags & WHERE_OR_SUBCLAUSE)!=0 ){
        iIndexCur = iAuxArg;
        op = OP_ReopenIdx;
      }else{
        iIndexCur = pParse->nTab++;
      }
      pLevel->iIdxCur = iIndexCur;
      assert( pIx->pSchema==pTab->pSchema );
      assert( iIndexCur>=0 );
      if( op ){
        sqlite3VdbeAddOp3(v, op, iIndexCur, pIx->tnum, iDb);
        sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        if( (pLoop->wsFlags & WHERE_CONSTRAINT)!=0
         && (pLoop->wsFlags & (WHERE_COLUMN_RANGE|WHERE_SKIPSCAN))==0
         && (pWInfo->wctrlFlags&WHERE_ORDERBY_MIN)==0
         && pWInfo->eDistinct!=WHERE_DISTINCT_ORDERED
        ){
          sqlite3VdbeChangeP5(v, OPFLAG_SEEKEQ); /* Hint to COMDB2 */
        }
        VdbeComment((v, "%s", pIx->zName));
#ifdef SQLITE_ENABLE_COLUMN_USED_MASK
        {
          u64 colUsed = 0;
          int ii, jj;
          for(ii=0; ii<pIx->nColumn; ii++){
            jj = pIx->aiColumn[ii];
            if( jj<0 ) continue;
            if( jj>63 ) jj = 63;
            if( (pTabItem->colUsed & MASKBIT(jj))==0 ) continue;
            colUsed |= ((u64)1)<<(ii<63 ? ii : 63);
          }
          sqlite3VdbeAddOp4Dup8(v, OP_ColumnsUsed, iIndexCur, 0, 0,
                                (u8*)&colUsed, P4_INT64);
        }
#endif /* SQLITE_ENABLE_COLUMN_USED_MASK */
      }
    }
    if( iDb>=0 ) sqlite3CodeVerifySchema(pParse, iDb);
  }
  pWInfo->iTop = sqlite3VdbeCurrentAddr(v);
  if( db->mallocFailed ) goto whereBeginError;

  /* Generate the code to do the search.  Each iteration of the for
  ** loop below generates code for a single nested loop of the VM
  ** program.
  */
  for(ii=0; ii<nTabList; ii++){
    int addrExplain;
    int wsFlags;
    pLevel = &pWInfo->a[ii];
    wsFlags = pLevel->pWLoop->wsFlags;
#ifndef SQLITE_OMIT_AUTOMATIC_INDEX
    if( (pLevel->pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 ){
      constructAutomaticIndex(pParse, &pWInfo->sWC,
                &pTabList->a[pLevel->iFrom], notReady, pLevel);
      if( db->mallocFailed ) goto whereBeginError;
    }
#endif
    addrExplain = sqlite3WhereExplainOneScan(
        pParse, pTabList, pLevel, wctrlFlags
    );
    pLevel->addrBody = sqlite3VdbeCurrentAddr(v);
    notReady = sqlite3WhereCodeOneLoopStart(pParse,v,pWInfo,ii,pLevel,notReady);
    pWInfo->iContinue = pLevel->addrCont;
    if( (wsFlags&WHERE_MULTI_OR)==0 && (wctrlFlags&WHERE_OR_SUBCLAUSE)==0 ){
      sqlite3WhereAddScanStatus(v, pTabList, pLevel, addrExplain);
    }
  }

  /* Done. */
  VdbeModuleComment((v, "Begin WHERE-core"));
  return pWInfo;

  /* Jump here if malloc fails */
whereBeginError:
  if( pWInfo ){
    pParse->nQueryLoop = pWInfo->savedNQueryLoop;
    whereInfoFree(db, pWInfo);
  }
  return 0;
}